

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.tweetnacl.c
# Opt level: O0

void sel25519(int64_t *p,int64_t *q,int64_t b)

{
  ulong uVar1;
  ulong local_38;
  size_t i;
  int64_t mask;
  int64_t tmp;
  int64_t b_local;
  int64_t *q_local;
  int64_t *p_local;
  
  for (local_38 = 0; local_38 < 0x10; local_38 = local_38 + 1) {
    uVar1 = (b - 1U ^ 0xffffffffffffffff) & (p[local_38] ^ q[local_38]);
    p[local_38] = uVar1 ^ p[local_38];
    q[local_38] = uVar1 ^ q[local_38];
  }
  return;
}

Assistant:

static void sel25519(gf p, gf q, int64_t b)
{
  int64_t tmp, mask = ~(b-1);
  size_t i;
  for (i = 0; i < 16; i++)
  {
    tmp = mask & (p[i] ^ q[i]);
    p[i] ^= tmp;
    q[i] ^= tmp;
  }
}